

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O1

btCollisionObject * __thiscall
btCollisionWorldImporter::createCollisionObject
          (btCollisionWorldImporter *this,btTransform *startTransform,btCollisionShape *shape,
          char *bodyName)

{
  int iVar1;
  int iVar2;
  btCollisionObject **ptr;
  btScalar bVar3;
  btScalar bVar4;
  btScalar bVar5;
  undefined8 uVar6;
  btCollisionObject *this_00;
  char *pcVar7;
  btCollisionObject **ppbVar8;
  long lVar9;
  long lVar10;
  char cVar11;
  int iVar12;
  btCollisionObject *colObj;
  char *newname;
  btCollisionObject *local_50;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_48;
  uint local_40;
  char *local_38;
  
  this_00 = (btCollisionObject *)btAlignedAllocInternal(0x150,0x10);
  btCollisionObject::btCollisionObject(this_00);
  this_00->m_updateRevision = this_00->m_updateRevision + 1;
  uVar6 = *(undefined8 *)((startTransform->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this_00->m_worldTransform).m_basis.m_el[0].m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this_00->m_worldTransform).m_basis.m_el[0].m_floats + 2) = uVar6;
  uVar6 = *(undefined8 *)((startTransform->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this_00->m_worldTransform).m_basis.m_el[1].m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this_00->m_worldTransform).m_basis.m_el[1].m_floats + 2) = uVar6;
  uVar6 = *(undefined8 *)((startTransform->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this_00->m_worldTransform).m_basis.m_el[2].m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this_00->m_worldTransform).m_basis.m_el[2].m_floats + 2) = uVar6;
  bVar3 = (startTransform->m_origin).m_floats[1];
  bVar4 = (startTransform->m_origin).m_floats[2];
  bVar5 = (startTransform->m_origin).m_floats[3];
  (this_00->m_worldTransform).m_origin.m_floats[0] = (startTransform->m_origin).m_floats[0];
  (this_00->m_worldTransform).m_origin.m_floats[1] = bVar3;
  (this_00->m_worldTransform).m_origin.m_floats[2] = bVar4;
  (this_00->m_worldTransform).m_origin.m_floats[3] = bVar5;
  local_50 = this_00;
  (*this_00->_vptr_btCollisionObject[2])(this_00,shape);
  (*this->m_collisionWorld->_vptr_btCollisionWorld[9])(this->m_collisionWorld,local_50,1,0xffffffff)
  ;
  if (bodyName != (char *)0x0) {
    local_38 = duplicateName(this,bodyName);
    local_48.m_pointer = local_50;
    btHashMap<btHashPtr,_const_char_*>::insert
              (&this->m_objectNameMap,(btHashPtr *)&local_48,&local_38);
    local_48.m_pointer = local_38;
    cVar11 = *local_38;
    if (cVar11 == '\0') {
      local_40 = 0x811c9dc5;
    }
    else {
      local_40 = 0x811c9dc5;
      pcVar7 = local_38;
      do {
        pcVar7 = pcVar7 + 1;
        local_40 = ((int)cVar11 ^ local_40) * 0x1000193;
        cVar11 = *pcVar7;
      } while (cVar11 != '\0');
    }
    btHashMap<btHashString,_btCollisionObject_*>::insert
              (&this->m_nameColObjMap,(btHashString *)&local_48,&local_50);
  }
  iVar1 = (this->m_allocatedCollisionObjects).m_size;
  iVar2 = (this->m_allocatedCollisionObjects).m_capacity;
  if (iVar1 == iVar2) {
    iVar12 = 1;
    if (iVar1 != 0) {
      iVar12 = iVar1 * 2;
    }
    if (iVar2 < iVar12) {
      if (iVar12 == 0) {
        ppbVar8 = (btCollisionObject **)0x0;
      }
      else {
        ppbVar8 = (btCollisionObject **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
      }
      lVar9 = (long)(this->m_allocatedCollisionObjects).m_size;
      if (0 < lVar9) {
        lVar10 = 0;
        do {
          ppbVar8[lVar10] = (this->m_allocatedCollisionObjects).m_data[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar9 != lVar10);
      }
      ptr = (this->m_allocatedCollisionObjects).m_data;
      if (ptr != (btCollisionObject **)0x0) {
        if ((this->m_allocatedCollisionObjects).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_allocatedCollisionObjects).m_data = (btCollisionObject **)0x0;
      }
      (this->m_allocatedCollisionObjects).m_ownsMemory = true;
      (this->m_allocatedCollisionObjects).m_data = ppbVar8;
      (this->m_allocatedCollisionObjects).m_capacity = iVar12;
    }
  }
  iVar1 = (this->m_allocatedCollisionObjects).m_size;
  (this->m_allocatedCollisionObjects).m_data[iVar1] = local_50;
  (this->m_allocatedCollisionObjects).m_size = iVar1 + 1;
  return local_50;
}

Assistant:

btCollisionObject* btCollisionWorldImporter::createCollisionObject(const btTransform& startTransform,btCollisionShape* shape, const char* bodyName)
{
	btCollisionObject* colObj = new btCollisionObject();
	colObj->setWorldTransform(startTransform);
	colObj->setCollisionShape(shape);
	m_collisionWorld->addCollisionObject(colObj);//todo: flags etc

	if (bodyName)
	{
		char* newname = duplicateName(bodyName);
		m_objectNameMap.insert(colObj,newname);
		m_nameColObjMap.insert(newname,colObj);
	}
	m_allocatedCollisionObjects.push_back(colObj);

	return colObj;
}